

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  size_t *psVar1;
  Header *pHVar2;
  long *plVar3;
  HttpHeaders *pHVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Header *pHVar9;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  WebSocket *extraout_RDX_00;
  WebSocket *extraout_RDX_01;
  WebSocket *pWVar10;
  void *in_R8;
  long lVar11;
  Own<kj::WebSocket> OVar12;
  Own<kj::HttpHeaders> headersCopy;
  WebSocketPipe pipe;
  undefined8 *local_c0;
  ArrayDisposer *local_b8;
  Array<kj::StringPtr> *local_b0;
  HttpHeaders *local_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  _func_int **local_90;
  _func_int **local_88;
  undefined1 local_80 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_58;
  Header *local_50;
  
  HttpHeaders::clone((HttpHeaders *)local_80,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)&local_c0,(HttpHeaders *)local_80);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_80);
  newWebSocketPipe();
  psVar1 = &(headers->indexedHeaders).size_;
  *(int *)psVar1 = (int)*psVar1 + 1;
  local_b0 = &headers->indexedHeaders;
  local_a8 = headers;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
            ((Promise<void> *)local_80,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
             &(headers->unindexedHeaders).builder.pos);
  pHVar9 = (Header *)operator_new(0x38);
  pHVar4 = local_a8;
  uVar5 = (undefined4)uStack_98;
  uVar6 = uStack_98._4_4_;
  uStack_98 = 0;
  uVar7 = local_80._8_4_;
  uVar8 = local_80._12_4_;
  local_80._8_8_ = (StringPtr *)0x0;
  (pHVar9->name).content.ptr = (char *)&PTR_send_004633a0;
  *(undefined4 *)&(pHVar9->name).content.size_ = local_a0;
  *(undefined4 *)((long)&(pHVar9->name).content.size_ + 4) = uStack_9c;
  *(undefined4 *)&(pHVar9->value).content.ptr = uVar5;
  *(undefined4 *)((long)&(pHVar9->value).content.ptr + 4) = uVar6;
  *(undefined1 *)&(pHVar9->value).content.size_ = 1;
  *(undefined4 *)&pHVar9[1].name.content.ptr = local_80._0_4_;
  *(undefined4 *)((long)&pHVar9[1].name.content.ptr + 4) = local_80._4_4_;
  *(undefined4 *)&pHVar9[1].name.content.size_ = uVar7;
  *(undefined4 *)((long)&pHVar9[1].name.content.size_ + 4) = uVar8;
  *(undefined2 *)&pHVar9[1].value.content.ptr = 0;
  if (local_a8 != (HttpHeaders *)0x0) {
    local_a8 = (HttpHeaders *)0x0;
    (*(code *)(local_b0->ptr->content).ptr)
              (local_b0,(long)&pHVar4->table + (long)pHVar4->table[-1].idsByName.disposer);
  }
  pHVar2 = (headers->unindexedHeaders).builder.ptr;
  local_80._0_4_ = 0x65;
  local_80._8_8_ = "Switching Protocols";
  local_80._16_8_ = 0x14;
  local_80._24_8_ = local_b8;
  local_58 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x28);
  (local_58->name).content.ptr = (char *)&PTR___cxa_pure_virtual_00453a18;
  (local_58->name).content.size_ = (size_t)local_c0;
  (local_58->value).content.ptr = (char *)local_b8;
  local_b8 = (ArrayDisposer *)0x0;
  (local_58->value).content.size_ =
       (size_t)&_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>
                ::instance;
  local_58[1].name.content.ptr = (char *)pHVar9;
  (local_58->name).content.ptr = (char *)&PTR_disposeImpl_00464eb8;
  local_80._32_4_ = 2;
  local_50 = pHVar9;
  (**(code **)(pHVar2->name).content.ptr)(pHVar2,local_80);
  OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
            ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_80 + 0x20));
  (this->super_Response)._vptr_Response = local_90;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = local_88;
  local_88 = (_func_int **)0x0;
  lVar11 = 0x10;
  pWVar10 = extraout_RDX;
  do {
    plVar3 = *(long **)((long)&uStack_98 + lVar11);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)&uStack_98 + lVar11) = 0;
      (**(code **)**(undefined8 **)((long)&local_a0 + lVar11))
                (*(undefined8 **)((long)&local_a0 + lVar11),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
      pWVar10 = extraout_RDX_00;
    }
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -0x10);
  if (local_b8 != (ArrayDisposer *)0x0) {
    local_b8 = (ArrayDisposer *)0x0;
    (**(code **)*local_c0)();
    pWVar10 = extraout_RDX_01;
  }
  OVar12.ptr = pWVar10;
  OVar12.disposer = (Disposer *)this;
  return OVar12;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }